

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O0

char * tokenise_search_path(char *searchpath)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  char path_sep;
  size_t len;
  uint j;
  uint i;
  char *newsearch;
  char *searchpath_local;
  
  newsearch = searchpath;
  if (searchpath == (char *)0x0) {
    newsearch = "";
  }
  sVar2 = strlen(newsearch);
  searchpath_local = (char *)malloc(sVar2 + 5);
  if (searchpath_local == (char *)0x0) {
    searchpath_local = (char *)0x0;
  }
  else {
    len._0_4_ = 0;
    for (len._4_4_ = 0; len._4_4_ < sVar2; len._4_4_ = len._4_4_ + 1) {
      if ((((ulong)len._4_4_ < sVar2 - 1) && (newsearch[len._4_4_] == ':')) &&
         (newsearch[len._4_4_ + 1] == ':')) {
        searchpath_local[(uint)len] = ':';
        len._4_4_ = len._4_4_ + 1;
        len._0_4_ = (uint)len + 1;
      }
      else {
        uVar4 = len._4_4_;
        if (((len._4_4_ == 0) || ((len._4_4_ != 0 && (newsearch[len._4_4_ - 1] == ':')))) &&
           ((iVar1 = strncmp(newsearch + len._4_4_,"http:",5), uVar3 = (uint)len, iVar1 == 0 ||
            (((iVar1 = strncmp(newsearch + len._4_4_,"ftp:",4), iVar1 == 0 ||
              (iVar1 = strncmp(newsearch + len._4_4_,"|http:",6), iVar1 == 0)) ||
             ((iVar1 = strncmp(newsearch + len._4_4_,"|ftp:",5), iVar1 == 0 ||
              ((iVar1 = strncmp(newsearch + len._4_4_,"URL=http:",9), iVar1 == 0 ||
               (iVar1 = strncmp(newsearch + len._4_4_,"URL=ftp:",8), iVar1 == 0)))))))))) {
          do {
            len._0_4_ = uVar3;
            uVar3 = (uint)len + 1;
            searchpath_local[(uint)len] = newsearch[len._4_4_];
            bVar5 = false;
            if (len._4_4_ < sVar2) {
              bVar5 = newsearch[len._4_4_] != ':';
              len._4_4_ = len._4_4_ + 1;
            }
          } while (bVar5);
          if (newsearch[len._4_4_] == ':') {
            len._4_4_ = len._4_4_ + 1;
          }
          if (newsearch[len._4_4_] == '/') {
            searchpath_local[uVar3] = newsearch[len._4_4_];
            uVar3 = (uint)len + 2;
            len._4_4_ = len._4_4_ + 1;
          }
          len._0_4_ = uVar3;
          uVar4 = (uint)len;
          uVar3 = len._4_4_;
          if (newsearch[len._4_4_] == '/') {
            searchpath_local[(uint)len] = newsearch[len._4_4_];
            uVar4 = (uint)len + 1;
            uVar3 = len._4_4_ + 1;
          }
          do {
            len._4_4_ = uVar3;
            len._0_4_ = uVar4;
            uVar3 = len._4_4_ + 1;
            uVar4 = (uint)len + 1;
            searchpath_local[(uint)len] = newsearch[len._4_4_];
            bVar5 = false;
            if ((uVar3 < sVar2) && (bVar5 = false, newsearch[uVar3] != ':')) {
              bVar5 = newsearch[uVar3] != '/';
            }
          } while (bVar5);
          len._0_4_ = (uint)len + 2;
          searchpath_local[uVar4] = newsearch[uVar3];
          uVar4 = len._4_4_ + 2;
          if (newsearch[len._4_4_ + 2] == ':') {
            uVar4 = len._4_4_ + 3;
          }
        }
        len._4_4_ = uVar4;
        if (newsearch[len._4_4_] == ':') {
          if (((uint)len != 0) && (searchpath_local[(uint)len - 1] != '\0')) {
            searchpath_local[(uint)len] = '\0';
            len._0_4_ = (uint)len + 1;
          }
        }
        else {
          searchpath_local[(uint)len] = newsearch[len._4_4_];
          len._0_4_ = (uint)len + 1;
        }
      }
    }
    if ((uint)len != 0) {
      searchpath_local[(uint)len] = '\0';
      len._0_4_ = (uint)len + 1;
    }
    searchpath_local[(uint)len] = '.';
    searchpath_local[(uint)len + 1] = '/';
    searchpath_local[(uint)len + 2] = '\0';
    searchpath_local[(uint)len + 3] = '\0';
  }
  return searchpath_local;
}

Assistant:

char *tokenise_search_path(char *searchpath) {
    char *newsearch;
    unsigned int i, j;
    size_t len;
#ifdef _WIN32
    char path_sep = ';';
#else
    char path_sep = ':';
#endif

    if (!searchpath)
	searchpath="";

    newsearch = (char *)malloc((len = strlen(searchpath))+5);
    if (!newsearch)
	return NULL;

    for (i = 0, j = 0; i < len; i++) {
	/* "::" => ":". Used for escaping colons in http://foo */
	if (i < len-1 && searchpath[i] == ':' && searchpath[i+1] == ':') {
	    newsearch[j++] = ':';
	    i++;
	    continue;
	}

	/* Handle http:// and ftp:// too without :: */
	if (path_sep == ':') {
	    if ((i == 0 || (i > 0 && searchpath[i-1] == ':')) &&
		(!strncmp(&searchpath[i], "http:",     5) ||
		 !strncmp(&searchpath[i], "ftp:",      4) ||
		 !strncmp(&searchpath[i], "|http:",    6) ||
		 !strncmp(&searchpath[i], "|ftp:",     5) ||
		 !strncmp(&searchpath[i], "URL=http:", 9) ||
		 !strncmp(&searchpath[i], "URL=ftp:",  8))) {
		do {
		    newsearch[j++] = searchpath[i];
		} while (i<len && searchpath[i++] != ':');
		if (searchpath[i] == ':')
		    i++;
		if (searchpath[i]=='/')
		    newsearch[j++] = searchpath[i++];
		if (searchpath[i]=='/')
		    newsearch[j++] = searchpath[i++];
		// Look for host:port
		do {
		    newsearch[j++] = searchpath[i++];
		} while (i<len && searchpath[i] != ':' && searchpath[i] != '/');
		newsearch[j++] = searchpath[i++];
		if (searchpath[i] == ':')
		    i++;
	    }
	}

	if (searchpath[i] == path_sep) {
	    /* Skip blank path components */
	    if (j && newsearch[j-1] != 0)
		newsearch[j++] = 0;
	} else {
	    newsearch[j++] = searchpath[i];
	}
    }

    if (j)
	newsearch[j++] = 0;
    newsearch[j++] = '.';
    newsearch[j++] = '/';
    newsearch[j++] = 0;
    newsearch[j++] = 0;
    
    return newsearch;
}